

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_harmonic_symplectic.c
# Opt level: O0

int vdot(sunrealtype t,N_Vector yvec,N_Vector ydotvec,void *user_data)

{
  double *pdVar1;
  long lVar2;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunrealtype omega2;
  sunrealtype x;
  sunrealtype *ydot;
  sunrealtype *y;
  UserData *udata;
  
  pdVar1 = (double *)N_VGetArrayPointer(in_RDI);
  lVar2 = N_VGetArrayPointer(in_RSI);
  *(double *)(lVar2 + 8) = -(*(double *)(in_RDX + 0x10) * *(double *)(in_RDX + 0x10)) * *pdVar1;
  return 0;
}

Assistant:

int vdot(sunrealtype t, N_Vector yvec, N_Vector ydotvec, void* user_data)
{
  UserData* udata          = (UserData*)user_data;
  sunrealtype* y           = N_VGetArrayPointer(yvec);
  sunrealtype* ydot        = N_VGetArrayPointer(ydotvec);
  const sunrealtype x      = y[0];
  const sunrealtype omega2 = udata->omega * udata->omega;

  ydot[1] = -omega2 * x;

  return 0;
}